

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddUserItem(cmComputeLinkInformation *this,string *item,bool pathNotKnown)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  bool local_d1;
  undefined1 local_d0 [8];
  string out;
  string local_90;
  string local_70;
  string local_40 [8];
  string lib;
  bool pathNotKnown_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  lib.field_2._M_local_buf[0xf] = pathNotKnown;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)item);
  if (((*pcVar2 == '-') ||
      (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)item), *pcVar2 == '$')) ||
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)item), *pcVar2 == '`')) {
    lVar3 = std::__cxx11::string::find((char *)item,0x797f64);
    if ((lVar3 == 0) || (lVar3 = std::__cxx11::string::find((char *)item,0x7967b3), lVar3 == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldUserFlagItems,item);
    }
    SetCurrentLinkType(this,this->StartLinkType);
    lib.field_2._M_local_buf[0xe] = '\0';
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string_const&,bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,item,(bool *)(lib.field_2._M_local_buf + 0xe));
  }
  else {
    std::__cxx11::string::string(local_40);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,item);
    if (bVar1) {
      SetCurrentLinkType(this,LinkShared);
      cmsys::RegularExpression::match_abi_cxx11_(&local_70,&this->ExtractSharedLibraryName,2);
      std::__cxx11::string::operator=(local_40,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,item);
      if (bVar1) {
        SetCurrentLinkType(this,LinkStatic);
        cmsys::RegularExpression::match_abi_cxx11_(&local_90,&this->ExtractStaticLibraryName,2);
        std::__cxx11::string::operator=(local_40,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,item);
        if (bVar1) {
          SetCurrentLinkType(this,this->StartLinkType);
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)((long)&out.field_2 + 8),&this->ExtractAnyLibraryName,2);
          std::__cxx11::string::operator=(local_40,(string *)(out.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(out.field_2._M_local_buf + 8));
        }
        else {
          if ((lib.field_2._M_local_buf[0xf] & 1U) != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->OldUserFlagItems,item);
          }
          SetCurrentLinkType(this,this->StartLinkType);
          std::__cxx11::string::operator=(local_40,(string *)item);
        }
      }
    }
    std::__cxx11::string::string((string *)local_d0,(string *)&this->LibLinkFlag);
    std::__cxx11::string::operator+=((string *)local_d0,local_40);
    std::__cxx11::string::operator+=((string *)local_d0,(string *)&this->LibLinkSuffix);
    local_d1 = false;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
               ,&local_d1);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(std::string const& item,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  // Pass flags through untouched.
  if (item[0] == '-' || item[0] == '$' || item[0] == '`') {
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if (item.find("-l") == 0 || item.find("-Wl,-l") == 0) {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item);
    }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.emplace_back(item, false);
    return;
  }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if (this->ExtractSharedLibraryName.find(item)) {
// This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
  } else if (this->ExtractStaticLibraryName.find(item)) {
// This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
  } else if (this->ExtractAnyLibraryName.find(item)) {
// This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
  } else {
    // This is a name specified by the user.
    if (pathNotKnown) {
      this->OldUserFlagItems.push_back(item);
    }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item;
  }

  // Create an option to ask the linker to search for the library.
  std::string out = this->LibLinkFlag;
  out += lib;
  out += this->LibLinkSuffix;
  this->Items.emplace_back(out, false);

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}